

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy.h
# Opt level: O0

Contents __thiscall
snmalloc::
Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
::add_block(Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
            *this,Contents addr,size_t size)

{
  bool bVar1;
  Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
  *size_00;
  Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
  *pBVar2;
  size_t sVar3;
  unsigned_long uVar4;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *pRVar5;
  Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
  *in_RDX;
  Contents in_RSI;
  Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
  *in_RDI;
  RBPath path;
  Contents *e;
  Contents *__end0;
  Contents *__begin0;
  Contents (*__range2) [3];
  size_t idx;
  size_type in_stack_fffffffffffff758;
  RBPath *in_stack_fffffffffffff798;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *in_stack_fffffffffffff7a0;
  K in_stack_fffffffffffff7a8;
  RBPath *in_stack_fffffffffffff980;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *in_stack_fffffffffffff988;
  K in_stack_fffffffffffff990;
  reference local_60;
  Contents size_01;
  Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
  *this_00;
  Contents addr_00;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_8;
  
  size_01.unsafe_capptr = in_RSI.unsafe_capptr;
  addr_00.unsafe_capptr =
       (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
        *)in_RDI;
  validate_block(in_RDI,in_RSI,(size_t)in_RDX);
  bVar1 = remove_buddy(in_RDX,addr_00,(size_t)size_01.unsafe_capptr);
  if (bVar1) {
    size_00 = (Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
               *)((long)in_RDX << 1);
    local_8 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
               *)BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                 ::align_down(in_RSI,(size_t)size_00);
    this_00 = size_00;
    pBVar2 = (Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>
              *)bits::one_at_bit<unsigned_long,unsigned_long>(0xe);
    if (size_00 == pBVar2) {
      invariant(in_RDI);
    }
    else {
      local_8 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                 *)add_block(this_00,addr_00,size_01.unsafe_capptr);
    }
  }
  else {
    sVar3 = to_index(in_RDI,in_stack_fffffffffffff758);
    uVar4 = bits::max<unsigned_long>(in_RDI->empty_at_or_above,sVar3 + 1);
    in_RDI->empty_at_or_above = uVar4;
    local_60 = std::
               array<snmalloc::Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>::Entry,_10UL>
               ::operator[](&in_RDI->entries,in_stack_fffffffffffff758);
    pRVar5 = &local_60->tree;
    for (; local_60 != (reference)pRVar5; local_60 = (reference)(local_60->cache + 1)) {
      bVar1 = BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              ::equal((Contents)0x0,local_60->cache[0].unsafe_capptr);
      if (bVar1) {
        local_60->cache[0].unsafe_capptr = in_RSI.unsafe_capptr;
        return (Contents)
               (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
                *)0x0;
      }
    }
    std::
    array<snmalloc::Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>::Entry,_10UL>
    ::operator[](&in_RDI->entries,in_stack_fffffffffffff758);
    RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
    ::get_root_path((RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
                     *)in_RDI);
    std::
    array<snmalloc::Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>::Entry,_10UL>
    ::operator[](&in_RDI->entries,in_stack_fffffffffffff758);
    RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
    ::find(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798,in_stack_fffffffffffff7a8);
    std::
    array<snmalloc::Buddy<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_4UL,_14UL>::Entry,_10UL>
    ::operator[](&in_RDI->entries,in_stack_fffffffffffff758);
    RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
    ::insert_path(in_stack_fffffffffffff988,in_stack_fffffffffffff980,in_stack_fffffffffffff990);
    invariant(in_RDI);
    local_8 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
               *)0x0;
  }
  return (Contents)local_8;
}

Assistant:

typename Rep::Contents add_block(typename Rep::Contents addr, size_t size)
    {
      validate_block(addr, size);

      if (remove_buddy(addr, size))
      {
        // Add to next level cache
        size *= 2;
        addr = Rep::align_down(addr, size);
        if (size == bits::one_at_bit(MAX_SIZE_BITS))
        {
          // Invariant should be checked on all non-tail return paths.
          // Holds trivially here with current design.
          invariant();
          // Too big for this buddy allocator.
          return addr;
        }
        return add_block(addr, size);
      }

      auto idx = to_index(size);
      empty_at_or_above = bits::max(empty_at_or_above, idx + 1);

      for (auto& e : entries[idx].cache)
      {
        if (Rep::equal(Rep::null, e))
        {
          e = addr;
          return Rep::null;
        }
      }

      auto path = entries[idx].tree.get_root_path();
      entries[idx].tree.find(path, addr);
      entries[idx].tree.insert_path(path, addr);
      invariant();
      return Rep::null;
    }